

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getColByName(Highs *this,string *name,HighsInt *col)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  pointer ppVar4;
  undefined8 uVar5;
  int *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  HighsNameHash *in_RDI;
  iterator search;
  HighsLp *lp;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_30;
  _Prime_rehash_policy *local_28;
  int *local_20;
  HighsNameHash *this_00;
  HighsStatus local_4;
  
  local_28 = &in_RDI[5].name2index._M_h._M_rehash_policy;
  local_20 = in_RDX;
  this_00 = in_RDI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&in_RDI[0xb].name2index._M_h._M_element_count);
  if (sVar2 == 0) {
    local_4 = kError;
  }
  else {
    sVar3 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    *)0x49646d);
    if (sVar3 == 0) {
      HighsNameHash::form(this_00,in_RSI);
    }
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(in_stack_ffffffffffffffa8,(key_type *)0x4964a6);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      uVar5 = std::__cxx11::string::c_str();
      highsLogUser((HighsLogOptions *)&in_RDI[0x40].name2index._M_h._M_rehash_policy._M_next_resize,
                   kError,"Highs::getColByName: name %s is not found\n",uVar5);
      local_4 = kError;
    }
    else {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                             *)0x496525);
      if (ppVar4->second == -1) {
        uVar5 = std::__cxx11::string::c_str();
        highsLogUser((HighsLogOptions *)
                     &in_RDI[0x40].name2index._M_h._M_rehash_policy._M_next_resize,kError,
                     "Highs::getColByName: name %s is duplicated\n",uVar5);
        local_4 = kError;
      }
      else {
        ppVar4 = std::__detail::
                 _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                               *)0x49657a);
        *local_20 = ppVar4->second;
        local_4 = kOk;
      }
    }
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getColByName(const std::string& name, HighsInt& col) {
  HighsLp& lp = model_.lp_;
  if (!lp.col_names_.size()) return HighsStatus::kError;
  if (!lp.col_hash_.name2index.size()) lp.col_hash_.form(lp.col_names_);
  auto search = lp.col_hash_.name2index.find(name);
  if (search == lp.col_hash_.name2index.end()) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Highs::getColByName: name %s is not found\n", name.c_str());
    return HighsStatus::kError;
  }
  if (search->second == kHashIsDuplicate) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Highs::getColByName: name %s is duplicated\n", name.c_str());
    return HighsStatus::kError;
  }
  col = search->second;
  assert(lp.col_names_[col] == name);
  return HighsStatus::kOk;
}